

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Update(Parse *pParse,SrcList *pTabList,ExprList *pChanges,Expr *pWhere,int onError)

{
  byte bVar1;
  u8 uVar2;
  sqlite3 *db;
  Select *pSVar3;
  ExprList_item *pEVar4;
  bool bVar5;
  KeyInfo *pKVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  u32 uVar12;
  u32 uVar13;
  Table *pTab;
  Trigger *pTrigger;
  int *aRegIdx;
  Vdbe *p;
  WhereInfo *pWInfo;
  Index *pIVar14;
  int iVar15;
  char *pcVar16;
  long lVar17;
  int p1;
  Schema **ppSVar18;
  Parse *pPVar19;
  int iVar20;
  byte *pbVar21;
  byte *pbVar22;
  ulong uVar23;
  uint uVar24;
  int *piVar25;
  bool bVar26;
  bool bVar27;
  int local_124;
  Expr *local_100;
  int *local_f0;
  int local_e4;
  int local_d0;
  char *local_c0;
  int local_98;
  int tmask;
  KeyInfo *local_90;
  ulong local_88;
  Select *local_80;
  int local_74;
  ulong local_70;
  NameContext sNC;
  
  db = pParse->db;
  if (((pParse->nErr != 0) || (db->mallocFailed != '\0')) ||
     (pTab = sqlite3SrcListLookup(pParse,pTabList), pTab == (Table *)0x0)) {
    local_c0 = (char *)0x0;
    pPVar19 = (Parse *)0x0;
    local_f0 = (int *)0x0;
    aRegIdx = (int *)0x0;
    goto LAB_0015045e;
  }
  if (pTab->pSchema == (Schema *)0x0) {
    uVar23 = 0xfff0bdc0;
  }
  else {
    uVar24 = pParse->db->nDb;
    if ((int)uVar24 < 1) {
      uVar23 = 0;
    }
    else {
      ppSVar18 = &pParse->db->aDb->pSchema;
      uVar23 = 0;
      do {
        if (*ppSVar18 == pTab->pSchema) goto LAB_0015051a;
        uVar23 = uVar23 + 1;
        ppSVar18 = ppSVar18 + 4;
      } while (uVar24 != uVar23);
      uVar23 = (ulong)uVar24;
    }
  }
LAB_0015051a:
  pTrigger = sqlite3TriggersExist(pParse,pTab,0x6b,pChanges,&tmask);
  pSVar3 = pTab->pSelect;
  iVar8 = sqlite3ViewGetColumnNames(pParse,pTab);
  if ((iVar8 == 0) && (local_80 = pSVar3, iVar8 = sqlite3IsReadOnly(pParse,pTab,tmask), iVar8 == 0))
  {
    local_f0 = (int *)sqlite3DbMallocRaw(db,(int)pTab->nCol << 2);
    if (local_f0 == (int *)0x0) {
      local_f0 = (int *)0x0;
LAB_00150849:
      pPVar19 = (Parse *)0x0;
      local_c0 = (char *)0x0;
      aRegIdx = (int *)0x0;
      goto LAB_0015045e;
    }
    if (0 < (long)pTab->nCol) {
      memset(local_f0,0xff,(long)pTab->nCol << 2);
    }
    iVar8 = pParse->nTab;
    p1 = iVar8 + 1;
    pParse->nTab = p1;
    pTabList->a[0].iCursor = iVar8;
    pIVar14 = pTab->pIndex;
    if (pIVar14 != (Index *)0x0) {
      iVar15 = pParse->nTab;
      do {
        iVar15 = iVar15 + 1;
        pIVar14 = pIVar14->pNext;
      } while (pIVar14 != (Index *)0x0);
      pParse->nTab = iVar15;
    }
    sNC.pNext = (NameContext *)0x0;
    sNC.nRef = 0;
    sNC.nErr = 0;
    sNC.pEList = (ExprList *)0x0;
    sNC.pAggInfo = (AggInfo *)0x0;
    sNC.ncFlags = '\0';
    sNC._49_7_ = 0;
    iVar15 = (int)uVar23;
    sNC.pParse = pParse;
    sNC.pSrcList = pTabList;
    if (pChanges->nExpr < 1) {
      local_100 = (Expr *)0x0;
      local_124 = 0;
    }
    else {
      lVar17 = 0;
      local_124 = 0;
      local_100 = (Expr *)0x0;
      do {
        iVar9 = sqlite3ResolveExprNames(&sNC,pChanges->a[lVar17].pExpr);
        if (iVar9 != 0) {
LAB_00150ab7:
          aRegIdx = (int *)0x0;
          pPVar19 = (Parse *)0x0;
          local_c0 = (char *)0x0;
          goto LAB_0015045e;
        }
        sVar7 = pTab->nCol;
        uVar24 = (uint)sVar7;
        bVar26 = 0 < sVar7;
        if (sVar7 < 1) {
          uVar24 = 0;
        }
        else {
          uVar23 = 0;
          do {
            pbVar22 = (byte *)pTab->aCol[uVar23].zName;
            bVar1 = *pbVar22;
            pbVar21 = (byte *)pChanges->a[lVar17].zName;
            while ((bVar1 != 0 && (pbVar22 = pbVar22 + 1, ""[bVar1] == ""[*pbVar21]))) {
              pbVar21 = pbVar21 + 1;
              bVar1 = *pbVar22;
            }
            if (""[bVar1] == ""[*pbVar21]) {
              if (uVar23 == (long)pTab->iPKey) {
                local_100 = pChanges->a[lVar17].pExpr;
                local_124 = 1;
              }
              local_f0[uVar23] = (int)lVar17;
              uVar24 = (uint)uVar23;
              break;
            }
            uVar23 = uVar23 + 1;
            bVar26 = uVar23 < (ulong)(long)(int)uVar24;
          } while (uVar23 != (long)(int)uVar24);
        }
        if (!bVar26) {
          pEVar4 = pChanges->a;
          pcVar16 = pEVar4[lVar17].zName;
          iVar9 = sqlite3IsRowid(pcVar16);
          if (iVar9 == 0) {
            sqlite3ErrorMsg(pParse,"no such column: %s",pcVar16);
            pParse->checkSchema = '\x01';
            aRegIdx = (int *)0x0;
            goto LAB_00150590;
          }
          local_100 = pEVar4[lVar17].pExpr;
          uVar24 = 0xffffffff;
          local_124 = 1;
        }
        pcVar16 = "ROWID";
        if (-1 < (int)uVar24) {
          pcVar16 = pTab->aCol[uVar24].zName;
        }
        iVar9 = sqlite3AuthCheck(pParse,0x17,pTab->zName,pcVar16,db->aDb[iVar15].zName);
        if (iVar9 == 2) {
          local_f0[(int)uVar24] = -1;
        }
        else if (iVar9 == 1) goto LAB_00150ab7;
        lVar17 = lVar17 + 1;
      } while (lVar17 < pChanges->nExpr);
    }
    iVar9 = sqlite3FkRequired(pParse,pTab,local_f0,local_124);
    pIVar14 = pTab->pIndex;
    iVar20 = 0;
    if (pIVar14 != (Index *)0x0) {
      iVar20 = 0;
      do {
        iVar20 = iVar20 + 1;
        pIVar14 = pIVar14->pNext;
      } while (pIVar14 != (Index *)0x0);
    }
    if (iVar20 == 0) {
      aRegIdx = (int *)0x0;
    }
    else {
      aRegIdx = (int *)sqlite3DbMallocRaw(db,iVar20 << 3);
      if (aRegIdx == (int *)0x0) goto LAB_00150849;
    }
    pIVar14 = pTab->pIndex;
    if (pIVar14 != (Index *)0x0) {
      lVar17 = 0;
      do {
        if (iVar9 == 0 && local_124 == 0) {
          iVar20 = 0;
          if ((ulong)pIVar14->nColumn != 0) {
            uVar23 = 0;
            do {
              if (-1 < local_f0[pIVar14->aiColumn[uVar23]]) goto LAB_001508e0;
              uVar23 = uVar23 + 1;
            } while (pIVar14->nColumn != uVar23);
          }
        }
        else {
LAB_001508e0:
          iVar20 = pParse->nMem + 1;
          pParse->nMem = iVar20;
        }
        aRegIdx[lVar17] = iVar20;
        lVar17 = lVar17 + 1;
        pIVar14 = pIVar14->pNext;
      } while (pIVar14 != (Index *)0x0);
    }
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      if (pParse->nested == '\0') {
        p->field_0x9a = p->field_0x9a | 0x10;
      }
      sqlite3BeginWriteOperation(pParse,1,iVar15);
      if ((pTab->tabFlags & 0x10) == 0) {
        uVar24 = pParse->nMem;
        local_88 = (ulong)uVar24;
        iVar20 = uVar24 + 2;
        pParse->nMem = iVar20;
        if ((pTrigger != (Trigger *)0x0) || (local_74 = 0, iVar9 != 0)) {
          local_74 = uVar24 + 3;
          pParse->nMem = pTab->nCol + iVar20;
        }
        if (((pTrigger != (Trigger *)0x0) || (local_124 != 0)) || (local_e4 = iVar20, iVar9 != 0)) {
          local_e4 = pParse->nMem + 1;
          pParse->nMem = local_e4;
        }
        local_70 = (ulong)(uint)pParse->nMem;
        pParse->nMem = (int)pTab->nCol + pParse->nMem;
        if (local_80 == (Select *)0x0) {
          local_c0 = (char *)0x0;
          pPVar19 = (Parse *)0x0;
        }
        else {
          local_c0 = pParse->zAuthContext;
          pParse->zAuthContext = pTab->zName;
          sqlite3MaterializeView(pParse,pTab,pWhere,iVar8);
          pPVar19 = pParse;
        }
        iVar10 = sqlite3ResolveExprNames(&sNC,pWhere);
        if (iVar10 == 0) {
          uVar24 = (int)local_88 + 1;
          local_88 = (ulong)uVar24;
          sqlite3VdbeAddOp3(p,10,0,uVar24,iVar20);
          pWInfo = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,4,0);
          if (pWInfo != (WhereInfo *)0x0) {
            uVar2 = pWInfo->okOnePass;
            local_98 = 0;
            sqlite3VdbeAddOp3(p,0x41,iVar8,iVar20,0);
            if (uVar2 == '\0') {
              sqlite3VdbeAddOp3(p,0x70,(int)local_88,iVar20,0);
            }
            sqlite3WhereEnd(pWInfo);
            if (((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
              local_98 = pParse->nMem + 1;
              pParse->nMem = local_98;
              sqlite3VdbeAddOp3(p,7,0,local_98,0);
            }
            bVar26 = false;
            if (local_80 == (Select *)0x0) {
              if (uVar2 == '\0') {
                sqlite3OpenTable(pParse,iVar8,iVar15,pTab,0x28);
              }
              bVar26 = false;
              if (onError == 5) {
                bVar5 = false;
LAB_00150c4d:
                bVar26 = true;
              }
              else {
                pIVar14 = pTab->pIndex;
                if (pIVar14 == (Index *)0x0) {
                  bVar5 = true;
                }
                else {
                  do {
                    bVar27 = pIVar14->onError == '\x05';
                    bVar5 = !bVar27;
                    if (bVar27) goto LAB_00150c4d;
                    pIVar14 = pIVar14->pNext;
                  } while (pIVar14 != (Index *)0x0);
                }
              }
              local_d0 = iVar8;
              piVar25 = aRegIdx;
              for (pIVar14 = pTab->pIndex; pIVar14 != (Index *)0x0; pIVar14 = pIVar14->pNext) {
                local_d0 = local_d0 + 1;
                if ((!bVar5) || (0 < *piVar25)) {
                  local_90 = sqlite3IndexKeyinfo(pParse,pIVar14);
                  iVar10 = sqlite3VdbeAddOp3(p,0x28,local_d0,pIVar14->tnum,iVar15);
                  sqlite3VdbeChangeP4(p,iVar10,(char *)local_90,-0x10);
                }
                piVar25 = piVar25 + 1;
              }
            }
            if (uVar2 == '\0') {
              uVar24 = sqlite3VdbeAddOp3(p,0x71,(int)local_88,0,iVar20);
            }
            else {
              uVar11 = sqlite3VdbeAddOp3(p,0x4a,iVar20,0,0);
              uVar24 = sqlite3VdbeAddOp3(p,1,0,0,0);
              if ((-1 < (int)uVar11) && (uVar11 < (uint)p->nOp)) {
                p->aOp[uVar11].p2 = p->nOp;
              }
            }
            sqlite3VdbeAddOp3(p,0x36,iVar8,uVar24,iVar20);
            if (local_124 != 0) {
              sqlite3ExprCode(pParse,local_100,local_e4);
              sqlite3VdbeAddOp3(p,0x15,local_e4,0,0);
            }
            local_90 = (KeyInfo *)CONCAT44(local_90._4_4_,(int)local_70 + 1);
            if ((pTrigger != (Trigger *)0x0) || (iVar9 != 0)) {
              if (iVar9 == 0) {
                uVar12 = 0;
              }
              else {
                uVar12 = sqlite3FkOldmask(pParse,pTab);
              }
              uVar13 = sqlite3TriggerColmask(pParse,pTrigger,pChanges,0,3,pTab,onError);
              iVar15 = local_74;
              if (0 < pTab->nCol) {
                uVar23 = 0;
                do {
                  uVar11 = (uint)uVar23;
                  if (((local_f0[uVar23] < 0) || ((uVar13 | uVar12) == 0xffffffff)) ||
                     ((uVar23 < 0x20 && (((uVar13 | uVar12) >> (uVar11 & 0x1f) & 1) != 0)))) {
                    sqlite3ExprCodeGetColumnOfTable(p,pTab,iVar8,uVar11,iVar15 + uVar11);
                  }
                  else {
                    sqlite3VdbeAddOp3(p,10,0,iVar15 + uVar11,0);
                  }
                  uVar23 = uVar23 + 1;
                } while ((long)uVar23 < (long)pTab->nCol);
              }
              if (local_124 == 0) {
                sqlite3VdbeAddOp3(p,0xe,iVar20,local_e4,0);
              }
            }
            uVar12 = sqlite3TriggerColmask(pParse,pTrigger,pChanges,1,1,pTab,onError);
            sqlite3VdbeAddOp3(p,10,0,(int)local_90,(int)local_70 + (int)pTab->nCol);
            pKVar6 = local_90;
            sVar7 = pTab->nCol;
            if (0 < sVar7) {
              uVar23 = 0;
              do {
                if (uVar23 != (uint)(int)pTab->iPKey) {
                  uVar11 = (uint)uVar23;
                  if ((long)local_f0[uVar23] < 0) {
                    if (((0x1f < uVar23) || ((tmask & 1U) == 0)) ||
                       ((uVar12 >> (uVar11 & 0x1f) & 1) != 0)) {
                      iVar15 = (int)pKVar6 + uVar11;
                      sqlite3VdbeAddOp3(p,0x1d,iVar8,uVar11,iVar15);
                      sqlite3ColumnDefault(p,pTab,uVar11,iVar15);
                    }
                  }
                  else {
                    sqlite3ExprCode(pParse,pChanges->a[local_f0[uVar23]].pExpr,(int)pKVar6 + uVar11)
                    ;
                  }
                }
                uVar23 = uVar23 + 1;
                sVar7 = pTab->nCol;
              } while ((long)uVar23 < (long)sVar7);
            }
            if ((tmask & 1U) != 0) {
              sqlite3VdbeAddOp3(p,0x1e,(int)local_90,(int)sVar7,0);
              sqlite3TableAffinityStr(p,pTab);
              sqlite3CodeRowTrigger(pParse,pTrigger,0x6b,pChanges,1,pTab,iVar20,onError,uVar24);
              sqlite3VdbeAddOp3(p,0x36,iVar8,uVar24,iVar20);
              pKVar6 = local_90;
              if (0 < pTab->nCol) {
                uVar23 = 0;
                do {
                  if ((local_f0[uVar23] < 0) && (uVar23 != (uint)(int)pTab->iPKey)) {
                    iVar15 = (int)uVar23;
                    iVar10 = (int)pKVar6 + iVar15;
                    sqlite3VdbeAddOp3(p,0x1d,iVar8,iVar15,iVar10);
                    sqlite3ColumnDefault(p,pTab,iVar15,iVar10);
                  }
                  uVar23 = uVar23 + 1;
                } while ((long)uVar23 < (long)pTab->nCol);
              }
            }
            if (local_80 == (Select *)0x0) {
              iVar15 = iVar20;
              if (local_124 == 0) {
                iVar15 = 0;
              }
              sqlite3GenerateConstraintChecks
                        (pParse,pTab,iVar8,local_e4,aRegIdx,iVar15,1,onError,uVar24,(int *)0x0);
              if (iVar9 != 0) {
                sqlite3FkCheck(pParse,pTab,iVar20,0);
              }
              uVar11 = sqlite3VdbeAddOp3(p,0x36,iVar8,0,iVar20);
              sqlite3GenerateRowIndexDelete(pParse,pTab,iVar8,aRegIdx);
              if (local_124 != 0 || iVar9 != 0) {
                sqlite3VdbeAddOp3(p,0x3b,iVar8,0,0);
              }
              if ((-1 < (int)uVar11) && (uVar11 < (uint)p->nOp)) {
                p->aOp[uVar11].p2 = p->nOp;
              }
              if (iVar9 == 0) {
                sqlite3CompleteInsertion(pParse,pTab,iVar8,local_e4,aRegIdx,1,0,0);
              }
              else {
                sqlite3FkCheck(pParse,pTab,0,local_e4);
                sqlite3CompleteInsertion(pParse,pTab,iVar8,local_e4,aRegIdx,1,0,0);
                sqlite3FkActions(pParse,pTab,pChanges,iVar20);
              }
            }
            if (((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3VdbeAddOp3(p,0x14,local_98,1,0);
            }
            sqlite3CodeRowTrigger(pParse,pTrigger,0x6b,pChanges,2,pTab,iVar20,onError,uVar24);
            sqlite3VdbeAddOp3(p,1,0,uVar24,0);
            if ((-1 < (int)uVar24) && (uVar24 < (uint)p->nOp)) {
              p->aOp[uVar24].p2 = p->nOp;
            }
            piVar25 = aRegIdx;
            for (pIVar14 = pTab->pIndex; pIVar14 != (Index *)0x0; pIVar14 = pIVar14->pNext) {
              if ((bVar26) || (0 < *piVar25)) {
                sqlite3VdbeAddOp3(p,0x2d,p1,0,0);
              }
              piVar25 = piVar25 + 1;
              p1 = p1 + 1;
            }
            sqlite3VdbeAddOp3(p,0x2d,iVar8,0,0);
            if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3AutoincrementEnd(pParse);
            }
            if ((((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) &&
               (pParse->nested == '\0')) {
              sqlite3VdbeAddOp3(p,0x10,local_98,1,0);
              sqlite3VdbeSetNumCols(p,1);
              if (p->db->mallocFailed == '\0') {
                sqlite3VdbeMemSetStr
                          (p->aColName,"rows updated",-1,'\x01',(_func_void_void_ptr *)0x0);
              }
            }
          }
        }
      }
      else {
        updateVirtualTable(pParse,pTabList,pTab,pChanges,local_100,local_f0,pWhere,onError);
        local_c0 = (char *)0x0;
        pPVar19 = (Parse *)0x0;
        pWhere = (Expr *)0x0;
        pTabList = (SrcList *)0x0;
      }
      goto LAB_0015045e;
    }
  }
  else {
    local_f0 = (int *)0x0;
    aRegIdx = (int *)0x0;
  }
LAB_00150590:
  pPVar19 = (Parse *)0x0;
  local_c0 = (char *)0x0;
LAB_0015045e:
  if (pPVar19 != (Parse *)0x0) {
    pPVar19->zAuthContext = local_c0;
  }
  sqlite3DbFree(db,aRegIdx);
  sqlite3DbFree(db,local_f0);
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprListDelete(db,pChanges);
  sqlite3ExprDelete(db,pWhere);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Update(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table in which we should change things */
  ExprList *pChanges,    /* Things to be changed */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  int onError            /* How to handle constraint errors */
){
  int i, j;              /* Loop counters */
  Table *pTab;           /* The table to be updated */
  int addr = 0;          /* VDBE instruction address of the start of the loop */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Vdbe *v;               /* The virtual database engine */
  Index *pIdx;           /* For looping over indices */
  int nIdx;              /* Number of indices that need updating */
  int iCur;              /* VDBE Cursor number of pTab */
  sqlite3 *db;           /* The database structure */
  int *aRegIdx = 0;      /* One register assigned to each index to be updated */
  int *aXRef = 0;        /* aXRef[i] is the index in pChanges->a[] of the
                         ** an expression for the i-th column of the table.
                         ** aXRef[i]==-1 if the i-th column is not changed. */
  int chngRowid;         /* True if the record number is being changed */
  Expr *pRowidExpr = 0;  /* Expression defining the new record number */
  int openAll = 0;       /* True if all indices need to be opened */
  AuthContext sContext;  /* The authorization context */
  NameContext sNC;       /* The name-context to resolve expressions in */
  int iDb;               /* Database containing the table being updated */
  int okOnePass;         /* True for one-pass algorithm without the FIFO */
  int hasFK;             /* True if foreign key processing is required */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;            /* True when updating a view (INSTEAD OF trigger) */
  Trigger *pTrigger;     /* List of triggers on pTab, if required */
  int tmask;             /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
#endif
  int newmask;           /* Mask of NEW.* columns accessed by BEFORE triggers */

  /* Register Allocations */
  int regRowCount = 0;   /* A count of rows changed */
  int regOldRowid;       /* The old rowid */
  int regNewRowid;       /* The new rowid */
  int regNew;            /* Content of the NEW.* table in triggers */
  int regOld = 0;        /* Content of OLD.* table in triggers */
  int regRowSet = 0;     /* Rowset of rows to be updated */

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto update_cleanup;
  }
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to update. 
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ) goto update_cleanup;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);

  /* Figure out if we have any triggers and if the table being
  ** updated is a view.
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_UPDATE, pChanges, &tmask);
  isView = pTab->pSelect!=0;
  assert( pTrigger || tmask==0 );
#else
# define pTrigger 0
# define isView 0
# define tmask 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto update_cleanup;
  }
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto update_cleanup;
  }
  aXRef = sqlite3DbMallocRaw(db, sizeof(int) * pTab->nCol );
  if( aXRef==0 ) goto update_cleanup;
  for(i=0; i<pTab->nCol; i++) aXRef[i] = -1;

  /* Allocate a cursors for the main database table and for all indices.
  ** The index cursors might not be used, but if they are used they
  ** need to occur right after the database cursor.  So go ahead and
  ** allocate enough space, just in case.
  */
  pTabList->a[0].iCursor = iCur = pParse->nTab++;
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    pParse->nTab++;
  }

  /* Initialize the name-context */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;

  /* Resolve the column names in all the expressions of the
  ** of the UPDATE statement.  Also find the column index
  ** for each column to be updated in the pChanges array.  For each
  ** column to be updated, make sure we have authorization to change
  ** that column.
  */
  chngRowid = 0;
  for(i=0; i<pChanges->nExpr; i++){
    if( sqlite3ResolveExprNames(&sNC, pChanges->a[i].pExpr) ){
      goto update_cleanup;
    }
    for(j=0; j<pTab->nCol; j++){
      if( sqlite3StrICmp(pTab->aCol[j].zName, pChanges->a[i].zName)==0 ){
        if( j==pTab->iPKey ){
          chngRowid = 1;
          pRowidExpr = pChanges->a[i].pExpr;
        }
        aXRef[j] = i;
        break;
      }
    }
    if( j>=pTab->nCol ){
      if( sqlite3IsRowid(pChanges->a[i].zName) ){
        j = -1;
        chngRowid = 1;
        pRowidExpr = pChanges->a[i].pExpr;
      }else{
        sqlite3ErrorMsg(pParse, "no such column: %s", pChanges->a[i].zName);
        pParse->checkSchema = 1;
        goto update_cleanup;
      }
    }
#ifndef SQLITE_OMIT_AUTHORIZATION
    {
      int rc;
      rc = sqlite3AuthCheck(pParse, SQLITE_UPDATE, pTab->zName,
                            j<0 ? "ROWID" : pTab->aCol[j].zName,
                            db->aDb[iDb].zName);
      if( rc==SQLITE_DENY ){
        goto update_cleanup;
      }else if( rc==SQLITE_IGNORE ){
        aXRef[j] = -1;
      }
    }
#endif
  }

  hasFK = sqlite3FkRequired(pParse, pTab, aXRef, chngRowid);

  /* Allocate memory for the array aRegIdx[].  There is one entry in the
  ** array for each index associated with table being updated.  Fill in
  ** the value with a register number for indices that are to be used
  ** and with zero for unused indices.
  */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  if( nIdx>0 ){
    aRegIdx = sqlite3DbMallocRaw(db, sizeof(Index*) * nIdx );
    if( aRegIdx==0 ) goto update_cleanup;
  }
  for(j=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, j++){
    int reg;
    if( hasFK || chngRowid ){
      reg = ++pParse->nMem;
    }else{
      reg = 0;
      for(i=0; i<pIdx->nColumn; i++){
        if( aXRef[pIdx->aiColumn[i]]>=0 ){
          reg = ++pParse->nMem;
          break;
        }
      }
    }
    aRegIdx[j] = reg;
  }

  /* Begin generating code. */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto update_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Virtual tables must be handled separately */
  if( IsVirtual(pTab) ){
    updateVirtualTable(pParse, pTabList, pTab, pChanges, pRowidExpr, aXRef,
                       pWhere, onError);
    pWhere = 0;
    pTabList = 0;
    goto update_cleanup;
  }
#endif

  /* Allocate required registers. */
  regRowSet = ++pParse->nMem;
  regOldRowid = regNewRowid = ++pParse->nMem;
  if( pTrigger || hasFK ){
    regOld = pParse->nMem + 1;
    pParse->nMem += pTab->nCol;
  }
  if( chngRowid || pTrigger || hasFK ){
    regNewRowid = ++pParse->nMem;
  }
  regNew = pParse->nMem + 1;
  pParse->nMem += pTab->nCol;

  /* Start the view context. */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* If we are trying to update a view, realize that view into
  ** a ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, pWhere, iCur);
  }
#endif

  /* Resolve the column names in all the expressions in the
  ** WHERE clause.
  */
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto update_cleanup;
  }

  /* Begin the database scan
  */
  sqlite3VdbeAddOp3(v, OP_Null, 0, regRowSet, regOldRowid);
  pWInfo = sqlite3WhereBegin(
      pParse, pTabList, pWhere, 0, 0, WHERE_ONEPASS_DESIRED, 0
  );
  if( pWInfo==0 ) goto update_cleanup;
  okOnePass = pWInfo->okOnePass;

  /* Remember the rowid of every item to be updated.
  */
  sqlite3VdbeAddOp2(v, OP_Rowid, iCur, regOldRowid);
  if( !okOnePass ){
    sqlite3VdbeAddOp2(v, OP_RowSetAdd, regRowSet, regOldRowid);
  }

  /* End the database scan loop.
  */
  sqlite3WhereEnd(pWInfo);

  /* Initialize the count of updated rows
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  if( !isView ){
    /* 
    ** Open every index that needs updating.  Note that if any
    ** index could potentially invoke a REPLACE conflict resolution 
    ** action, then we need to open all indices because we might need
    ** to be deleting some records.
    */
    if( !okOnePass ) sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite); 
    if( onError==OE_Replace ){
      openAll = 1;
    }else{
      openAll = 0;
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        if( pIdx->onError==OE_Replace ){
          openAll = 1;
          break;
        }
      }
    }
    for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
      assert( aRegIdx );
      if( openAll || aRegIdx[i]>0 ){
        KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
        sqlite3VdbeAddOp4(v, OP_OpenWrite, iCur+i+1, pIdx->tnum, iDb,
                       (char*)pKey, P4_KEYINFO_HANDOFF);
        assert( pParse->nTab>iCur+i+1 );
      }
    }
  }

  /* Top of the update loop */
  if( okOnePass ){
    int a1 = sqlite3VdbeAddOp1(v, OP_NotNull, regOldRowid);
    addr = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, a1);
  }else{
    addr = sqlite3VdbeAddOp3(v, OP_RowSetRead, regRowSet, 0, regOldRowid);
  }

  /* Make cursor iCur point to the record that is being updated. If
  ** this record does not exist for some reason (deleted by a trigger,
  ** for example, then jump to the next iteration of the RowSet loop.  */
  sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

  /* If the record number will change, set register regNewRowid to
  ** contain the new value. If the record number is not being modified,
  ** then regNewRowid is the same register as regOldRowid, which is
  ** already populated.  */
  assert( chngRowid || pTrigger || hasFK || regOldRowid==regNewRowid );
  if( chngRowid ){
    sqlite3ExprCode(pParse, pRowidExpr, regNewRowid);
    sqlite3VdbeAddOp1(v, OP_MustBeInt, regNewRowid);
  }

  /* If there are triggers on this table, populate an array of registers 
  ** with the required old.* column data.  */
  if( hasFK || pTrigger ){
    u32 oldmask = (hasFK ? sqlite3FkOldmask(pParse, pTab) : 0);
    oldmask |= sqlite3TriggerColmask(pParse, 
        pTrigger, pChanges, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onError
    );
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 || oldmask==0xffffffff || (i<32 && (oldmask & (1<<i))) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOld+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, regOld+i);
      }
    }
    if( chngRowid==0 ){
      sqlite3VdbeAddOp2(v, OP_Copy, regOldRowid, regNewRowid);
    }
  }

  /* Populate the array of registers beginning at regNew with the new
  ** row data. This array is used to check constaints, create the new
  ** table and index records, and as the values for any new.* references
  ** made by triggers.
  **
  ** If there are one or more BEFORE triggers, then do not populate the
  ** registers associated with columns that are (a) not modified by
  ** this UPDATE statement and (b) not accessed by new.* references. The
  ** values for registers not modified by the UPDATE must be reloaded from 
  ** the database after the BEFORE triggers are fired anyway (as the trigger 
  ** may have modified them). So not loading those that are not going to
  ** be used eliminates some redundant opcodes.
  */
  newmask = sqlite3TriggerColmask(
      pParse, pTrigger, pChanges, 1, TRIGGER_BEFORE, pTab, onError
  );
  sqlite3VdbeAddOp3(v, OP_Null, 0, regNew, regNew+pTab->nCol-1);
  for(i=0; i<pTab->nCol; i++){
    if( i==pTab->iPKey ){
      /*sqlite3VdbeAddOp2(v, OP_Null, 0, regNew+i);*/
    }else{
      j = aXRef[i];
      if( j>=0 ){
        sqlite3ExprCode(pParse, pChanges->a[j].pExpr, regNew+i);
      }else if( 0==(tmask&TRIGGER_BEFORE) || i>31 || (newmask&(1<<i)) ){
        /* This branch loads the value of a column that will not be changed 
        ** into a register. This is done if there are no BEFORE triggers, or
        ** if there are one or more BEFORE triggers that use this value via
        ** a new.* reference in a trigger program.
        */
        testcase( i==31 );
        testcase( i==32 );
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  /* Fire any BEFORE UPDATE triggers. This happens before constraints are
  ** verified. One could argue that this is wrong.
  */
  if( tmask&TRIGGER_BEFORE ){
    sqlite3VdbeAddOp2(v, OP_Affinity, regNew, pTab->nCol);
    sqlite3TableAffinityStr(v, pTab);
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
        TRIGGER_BEFORE, pTab, regOldRowid, onError, addr);

    /* The row-trigger may have deleted the row being updated. In this
    ** case, jump to the next row. No updates or AFTER triggers are 
    ** required. This behavior - what happens when the row being updated
    ** is deleted or renamed by a BEFORE trigger - is left undefined in the
    ** documentation.
    */
    sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

    /* If it did not delete it, the row-trigger may still have modified 
    ** some of the columns of the row being updated. Load the values for 
    ** all columns not modified by the update statement into their 
    ** registers in case this has happened.
    */
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 && i!=pTab->iPKey ){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  if( !isView ){
    int j1;                       /* Address of jump instruction */

    /* Do constraint checks. */
    sqlite3GenerateConstraintChecks(pParse, pTab, iCur, regNewRowid,
        aRegIdx, (chngRowid?regOldRowid:0), 1, onError, addr, 0);

    /* Do FK constraint checks. */
    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, regOldRowid, 0);
    }

    /* Delete the index entries associated with the current record.  */
    j1 = sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regOldRowid);
    sqlite3GenerateRowIndexDelete(pParse, pTab, iCur, aRegIdx);
  
    /* If changing the record number, delete the old record.  */
    if( hasFK || chngRowid ){
      sqlite3VdbeAddOp2(v, OP_Delete, iCur, 0);
    }
    sqlite3VdbeJumpHere(v, j1);

    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, 0, regNewRowid);
    }
  
    /* Insert the new index entries and the new record. */
    sqlite3CompleteInsertion(pParse, pTab, iCur, regNewRowid, aRegIdx, 1, 0, 0);

    /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
    ** handle rows (possibly in other tables) that refer via a foreign key
    ** to the row just updated. */ 
    if( hasFK ){
      sqlite3FkActions(pParse, pTab, pChanges, regOldRowid);
    }
  }

  /* Increment the row counter 
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
      TRIGGER_AFTER, pTab, regOldRowid, onError, addr);

  /* Repeat the above with the next record to be updated, until
  ** all record selected by the WHERE clause have been updated.
  */
  sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
  sqlite3VdbeJumpHere(v, addr);

  /* Close all tables */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    assert( aRegIdx );
    if( openAll || aRegIdx[i]>0 ){
      sqlite3VdbeAddOp2(v, OP_Close, iCur+i+1, 0);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Close, iCur, 0);

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows that were changed. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( (db->flags&SQLITE_CountRows) && !pParse->pTriggerTab && !pParse->nested ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows updated", SQLITE_STATIC);
  }

update_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3DbFree(db, aRegIdx);
  sqlite3DbFree(db, aXRef);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pChanges);
  sqlite3ExprDelete(db, pWhere);
  return;
}